

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void nmea_sentence_received(char *sentence,uint length,uchar sentences,uchar sentencenum)

{
  ssize_t sVar1;
  uchar sentencenum_local;
  uchar sentences_local;
  uint length_local;
  char *sentence_local;
  
  if (sentences == '\x01') {
    sVar1 = sendto(sock,sentence,(ulong)length,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
    if (sVar1 == -1) {
      abort();
    }
    if (debug_nmea != 0) {
      fprintf(_stderr,"%s",sentence);
    }
  }
  else {
    if (buffer_count + length < 0x800) {
      memcpy(buffer + buffer_count,sentence,(ulong)length);
      buffer_count = length + buffer_count;
    }
    else {
      buffer_count = 0;
    }
    if ((sentences == sentencenum) && (buffer_count != 0)) {
      sVar1 = sendto(sock,buffer,(ulong)buffer_count,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
      if (sVar1 == -1) {
        abort();
      }
      if (debug_nmea != 0) {
        fprintf(_stderr,"%s",buffer);
      }
      buffer_count = 0;
    }
  }
  return;
}

Assistant:

void nmea_sentence_received(const char *sentence,
                          unsigned int length,
                          unsigned char sentences,
                          unsigned char sentencenum) {
    if (sentences == 1) {
        if (sendto(sock, sentence, length, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
        if (debug_nmea) fprintf(stderr, "%s", sentence);
    } else {
        if (buffer_count + length < MAX_BUFFER_LENGTH) {
            memcpy(&buffer[buffer_count], sentence, length);
            buffer_count += length;
        } else {
            buffer_count=0;
        }

        if (sentences == sentencenum && buffer_count > 0) {
            if (sendto(sock, buffer, buffer_count, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
            if (debug_nmea) fprintf(stderr, "%s", buffer);
            buffer_count=0;
        };
    }
}